

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_jump(FuncState *fs)

{
  int iVar1;
  int *in_RDI;
  FuncState *unaff_retaddr;
  int j;
  int jpc;
  int in_stack_ffffffffffffffe8;
  OpCode in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int l2;
  
  l2 = in_RDI[0xe];
  in_RDI[0xe] = -1;
  iVar1 = luaK_codeABx((FuncState *)CONCAT44(l2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec
                       ,in_stack_ffffffffffffffe8,0);
  luaK_concat(unaff_retaddr,in_RDI,l2);
  return iVar1;
}

Assistant:

static int luaK_jump(FuncState*fs){
int jpc=fs->jpc;
int j;
fs->jpc=(-1);
j=luaK_codeAsBx(fs,OP_JMP,0,(-1));
luaK_concat(fs,&j,jpc);
return j;
}